

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O2

void test_next_on_array(uint32_t count)

{
  int iVar1;
  char *data;
  uint32_t uVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar6;
  char *d3;
  char *d2;
  char *pcVar5;
  
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  uVar4 = 0;
  fprintf(_stdout,"next/check on array(%u)",count);
  fputc(10,_stdout);
  data = mp_encode_array(buf + 1,count);
  uVar2 = count;
  while( true ) {
    bVar6 = uVar2 == 0;
    uVar2 = uVar2 - 1;
    if (bVar6) break;
    data = mp_encode_uint(data,uVar4 % 0x7f);
    uVar4 = uVar4 + 1;
  }
  iVar1 = 1;
  if (0xf < count) {
    iVar1 = (0xffff < count) + 3 + (uint)(0xffff < count);
  }
  uVar3 = iVar1 + count;
  pcVar5 = (char *)(ulong)uVar3;
  d2 = buf + 1;
  d3 = buf + 1;
  iVar1 = mp_check(&d2,str);
  _ok((uint)(iVar1 == 0),"!mp_check(&d2, data + BUF_MAXLEN)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x2a9,
      "mp_check(array %u))",count);
  _ok((uint)(data + -0x148121 == pcVar5),"(d1 - data) == (ptrdiff_t)len",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x2aa,
      "len(array %u) == %u",count,uVar3);
  _ok((uint)(d2 + -0x148121 == pcVar5),"(d2 - data) == (ptrdiff_t)len",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x2ab,
      "len(mp_check(array %u)) == %u",count,uVar3);
  mp_next(&d3);
  _ok((uint)(d3 + -0x148121 == pcVar5),"(d3 - data) == (ptrdiff_t)len",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x2ad,
      "len(mp_next(array %u)) == %u",count,uVar3);
  return;
}

Assistant:

static void
test_next_on_array(uint32_t count)
{
	note("next/check on array(%u)", count);
	char *d1 = data;
	d1 = mp_encode_array(d1, count);
	for (uint32_t i = 0; i < count; i++) {
		d1 = mp_encode_uint(d1, i % 0x7f); /* one byte */
	}
	uint32_t len = count + mp_sizeof_array(count);
	const char *d2 = data;
	const char *d3 = data;
	ok(!mp_check(&d2, data + BUF_MAXLEN), "mp_check(array %u))", count);
	is((d1 - data), (ptrdiff_t)len, "len(array %u) == %u", count, len);
	is((d2 - data), (ptrdiff_t)len, "len(mp_check(array %u)) == %u", count, len);
	mp_next(&d3);
	is((d3 - data), (ptrdiff_t)len, "len(mp_next(array %u)) == %u", count, len);
}